

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O3

exr_result_t
DwaCompressor_uncompress
          (DwaCompressor *me,uint8_t *inPtr,uint64_t iSize,void *uncompressed_data,
          uint64_t uncompressed_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint8_t *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char cVar6;
  CompressorScheme CVar7;
  ulong in_bytes;
  ulong in_bytes_00;
  ulong out_bytes_avail;
  ulong outsz;
  ulong nRaw;
  ulong uVar8;
  ulong uVar9;
  uint16_t *raw;
  exr_decode_pipeline_t *peVar10;
  CscChannelSet *pCVar11;
  exr_coding_channel_info_t *peVar12;
  char *pcVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  exr_result_t eVar16;
  exr_result_t eVar17;
  int iVar18;
  Classifier *__s;
  uint64_t uVar19;
  ulong uVar20;
  ChannelData *pCVar21;
  ulong uVar22;
  int iVar23;
  int *piVar24;
  long lVar25;
  uint8_t *puVar26;
  uint8_t *puVar27;
  int iVar28;
  size_t sVar29;
  long lVar30;
  size_t __n;
  bool bVar31;
  int iVar33;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Classifier tmpc;
  uint64_t readHere;
  uint8_t *tmpPtr;
  ushort *local_f8;
  uint8_t *local_f0;
  uint8_t *local_b0;
  undefined1 local_a8 [64];
  DctCoderChannelData *pDStack_68;
  int local_60;
  char *local_50;
  uint64_t local_48;
  ulong local_40;
  uint8_t *local_38;
  
  if (iSize < 0x58) {
    return 0x17;
  }
  memset(uncompressed_data,0,uncompressed_size);
  uVar22 = *(ulong *)(inPtr + 0x28);
  if (iSize < uVar22) {
    return 0x17;
  }
  uVar20 = *(ulong *)(inPtr + 0x20);
  if (iSize < uVar20) {
    return 0x17;
  }
  in_bytes = *(ulong *)(inPtr + 0x18);
  if (iSize < in_bytes) {
    return 0x17;
  }
  in_bytes_00 = *(ulong *)(inPtr + 0x10);
  if (iSize < in_bytes_00) {
    return 0x17;
  }
  if (iSize < in_bytes_00 + in_bytes + uVar20 + uVar22 + 0x58) {
    return 0x17;
  }
  out_bytes_avail = *(ulong *)(inPtr + 8);
  local_50 = *(char **)(inPtr + 0x30);
  outsz = *(ulong *)(inPtr + 0x38);
  nRaw = *(ulong *)(inPtr + 0x40);
  uVar8 = *(ulong *)(inPtr + 0x48);
  if ((long)(uVar22 | (ulong)local_50 | outsz | in_bytes | uVar20 | in_bytes_00 | out_bytes_avail |
             nRaw | uVar8) < 0) {
    return 0x17;
  }
  uVar9 = *(ulong *)inPtr;
  lVar25 = *(long *)(inPtr + 0x50);
  local_f8 = (ushort *)(inPtr + 0x58);
  if (uVar9 < 2) {
    me->_channelRules = sLegacyChannelRules;
    me->_channelRuleCount = 0x19;
  }
  else {
    if (iSize - 0x58 < 3) {
      return 0x17;
    }
    local_40 = (ulong)*local_f8;
    if (iSize - 0x58 < local_40 || local_40 < 2) {
      return 0x17;
    }
    local_b0 = inPtr + 0x5a;
    local_38 = local_b0;
    if (local_40 == 2) {
      sVar29 = 0;
    }
    else {
      sVar29 = 0;
      do {
        local_a8._0_16_ = (undefined1  [16])0x0;
        local_a8._16_8_ = (uint8_t *)0x0;
        local_48 = 0;
        eVar16 = Classifier_read((Classifier *)local_a8,&local_38,&local_48);
        uVar19 = local_48;
        if (((char *)local_a8._0_8_ != (char *)0x0) && (local_a8[0x15] == '\0')) {
          internal_exr_free((void *)local_a8._0_8_);
        }
        sVar29 = sVar29 + 1;
      } while ((eVar16 == 0) && (uVar19 != 0));
      if (eVar16 != 0) {
        return eVar16;
      }
    }
    me->_channelRuleCount = sVar29;
    __s = (Classifier *)internal_exr_alloc(sVar29 * 0x18);
    me->_channelRules = __s;
    if (__s == (Classifier *)0x0) {
      return 1;
    }
    memset(__s,0,sVar29 * 0x18);
    if (sVar29 != 0) {
      lVar30 = 0;
      do {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_a8._8_8_;
        local_a8._0_16_ = auVar14 << 0x40;
        Classifier_read((Classifier *)((long)&me->_channelRules->_suffix + lVar30),&local_b0,
                        (uint64_t *)local_a8);
        lVar30 = lVar30 + 0x18;
        sVar29 = sVar29 - 1;
      } while (sVar29 != 0);
    }
    local_f8 = (ushort *)((long)local_f8 + local_40);
  }
  eVar16 = DwaCompressor_initializeBuffers(me,(size_t *)&local_b0);
  if (eVar16 != 0) {
    return eVar16;
  }
  puVar26 = (uint8_t *)me->_decode->unpacked_buffer;
  local_b0 = (uint8_t *)me->_decode->unpacked_alloc_size;
  if (2 < uVar9) {
    return 0x16;
  }
  puVar27 = me->_packedAcBuffer;
  local_f0 = me->_packedDcBuffer;
  DwaCompressor_setupChannelData(me);
  if (in_bytes_00 != 0) {
    if (me->_planarUncBufferSize[0] < out_bytes_avail) {
      return 0x17;
    }
    eVar16 = exr_uncompress_buffer
                       (local_f8,in_bytes_00,me->_planarUncBuffer[0],out_bytes_avail,(size_t *)0x0);
    if (eVar16 != 0) {
      return 0x17;
    }
  }
  puVar3 = (uint8_t *)((long)local_f8 + in_bytes_00);
  if (in_bytes != 0) {
    raw = (uint16_t *)me->_packedAcBuffer;
    if (raw == (uint16_t *)0x0) {
      return 0x17;
    }
    pcVar13 = (char *)(nRaw * 2);
    if ((char *)me->_packedAcBufferSize < pcVar13) {
      return 0x17;
    }
    if (lVar25 == 1) {
      eVar16 = exr_uncompress_buffer(puVar3,in_bytes,raw,(size_t)pcVar13,(size_t *)local_a8);
      if (eVar16 != 0) {
        return eVar16;
      }
      if (pcVar13 != (char *)local_a8._0_8_) {
        return 0x17;
      }
    }
    else {
      if (lVar25 != 0) {
        return 0x17;
      }
      peVar10 = me->_decode;
      eVar16 = internal_huf_decompress
                         (peVar10,puVar3,in_bytes,raw,nRaw,peVar10->scratch_buffer_1,
                          peVar10->scratch_alloc_size_1);
      if (eVar16 != 0) {
        return eVar16;
      }
    }
  }
  if (uVar20 == 0) {
    if (uVar8 != 0) {
      return 0x17;
    }
LAB_0010a802:
    pcVar13 = local_50;
    if ((outsz == 0) ||
       ((((eVar16 = 0x17, local_50 <= (char *)me->_rleBufferSize &&
          (outsz <= me->_planarUncBufferSize[2])) &&
         (eVar17 = exr_uncompress_buffer
                             (puVar3 + in_bytes + uVar20,uVar22,me->_rleBuffer,(size_t)local_50,
                              (size_t *)local_a8), eVar17 == 0)) &&
        (((char *)local_a8._0_8_ == pcVar13 &&
         (uVar19 = internal_rle_decompress
                             (me->_planarUncBuffer[2],outsz,me->_rleBuffer,(uint64_t)pcVar13),
         uVar19 == outsz)))))) {
      auVar14 = _DAT_0012a0e0;
      iVar23 = me->_numChannels;
      uVar22 = (ulong)iVar23;
      if (uVar22 != 0) {
        uVar20 = uVar22 + 3 & 0xfffffffffffffffc;
        lVar25 = uVar22 - 1;
        auVar32._8_4_ = (int)lVar25;
        auVar32._0_8_ = lVar25;
        auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
        piVar24 = &me->_channelData[3].processed;
        auVar32 = auVar32 ^ _DAT_0012a0e0;
        auVar34 = _DAT_0012a0b0;
        auVar35 = _DAT_0012a0c0;
        do {
          auVar36 = auVar35 ^ auVar14;
          iVar33 = auVar32._4_4_;
          if ((bool)(~(auVar36._4_4_ == iVar33 && auVar32._0_4_ < auVar36._0_4_ ||
                      iVar33 < auVar36._4_4_) & 1)) {
            piVar24[-0x1b0] = 0;
          }
          if ((auVar36._12_4_ != auVar32._12_4_ || auVar36._8_4_ <= auVar32._8_4_) &&
              auVar36._12_4_ <= auVar32._12_4_) {
            piVar24[-0x120] = 0;
          }
          auVar36 = auVar34 ^ auVar14;
          iVar28 = auVar36._4_4_;
          if (iVar28 <= iVar33 && (iVar28 != iVar33 || auVar36._0_4_ <= auVar32._0_4_)) {
            piVar24[-0x90] = 0;
            *piVar24 = 0;
          }
          lVar25 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 4;
          auVar35._8_8_ = lVar25 + 4;
          lVar25 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 4;
          auVar34._8_8_ = lVar25 + 4;
          piVar24 = piVar24 + 0x240;
          uVar20 = uVar20 - 4;
        } while (uVar20 != 0);
      }
      iVar33 = me->_min[1];
      iVar28 = me->_max[1];
      if (iVar33 <= iVar28) {
        do {
          if (iVar23 == 0) {
            iVar23 = 0;
          }
          else {
            lVar25 = 0x20;
            uVar20 = 0;
            do {
              lVar30 = *(long *)((long)(me->_channelData->_dctData)._dctData + lVar25 + -0x40);
              if (iVar33 % *(int *)(lVar30 + 0x14) == 0) {
                eVar16 = DctCoderChannelData_push_row
                                   ((DctCoderChannelData *)
                                    ((long)(me->_channelData->_dctData)._dctData + lVar25 + -0x20),
                                    puVar26);
                if (eVar16 != 0) {
                  return 1;
                }
                puVar26 = puVar26 + (long)*(char *)(lVar30 + 0x19) * (long)*(int *)(lVar30 + 0xc);
                uVar22 = (ulong)(uint)me->_numChannels;
              }
              uVar20 = uVar20 + 1;
              iVar23 = (int)uVar22;
              lVar25 = lVar25 + 0x240;
            } while (uVar20 < (ulong)(long)iVar23);
            iVar28 = me->_max[1];
          }
          bVar31 = iVar33 < iVar28;
          iVar33 = iVar33 + 1;
        } while (bVar31);
      }
      if (me->_numCscChannelSets != 0) {
        pCVar21 = me->_channelData;
        lVar25 = 8;
        uVar22 = 0;
        do {
          pCVar11 = me->_cscChannelSets;
          iVar23 = *(int *)((long)pCVar11->idx + lVar25 + -8);
          if (pCVar21[iVar23].compression != LOSSY_DCT) {
            return 0x17;
          }
          iVar33 = *(int *)((long)pCVar11->idx + lVar25 + -4);
          if (pCVar21[iVar33].compression != LOSSY_DCT) {
            return 0x17;
          }
          iVar28 = *(int *)((long)pCVar11->idx + lVar25);
          if (pCVar21[iVar28].compression != LOSSY_DCT) {
            return 0x17;
          }
          local_a8._16_8_ = puVar27 + nRaw * 2;
          peVar12 = pCVar21[iVar23].chan;
          local_a8._48_8_ = &pCVar21[iVar23]._dctData;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = puVar27;
          local_a8._0_16_ = auVar36 << 0x40;
          local_a8._24_8_ = local_f0;
          local_a8._32_8_ = dwaCompressorToLinear;
          uVar1 = peVar12->height;
          uVar4 = peVar12->width;
          local_a8._44_4_ = uVar1;
          local_a8._40_4_ = uVar4;
          pDStack_68 = &pCVar21[iVar28]._dctData;
          local_a8._56_8_ = &pCVar21[iVar33]._dctData;
          local_60 = 3;
          eVar16 = LossyDctDecoder_execute((LossyDctDecoder *)local_a8);
          pCVar21 = me->_channelData;
          pCVar21[iVar23].processed = 1;
          pCVar21[iVar33].processed = 1;
          pCVar21[iVar28].processed = 1;
          if (eVar16 != 0) {
            return eVar16;
          }
          local_f0 = local_f0 + (long)(int)local_a8._4_4_ * 2;
          puVar27 = puVar27 + (long)(int)local_a8._0_4_ * 2;
          uVar22 = uVar22 + 1;
          lVar25 = lVar25 + 0xc;
        } while (uVar22 < (ulong)(long)me->_numCscChannelSets);
      }
      iVar23 = me->_numChannels;
      if (iVar23 == 0) {
        eVar16 = 0;
      }
      else {
        lVar25 = 0x210;
        uVar22 = 0;
        do {
          pCVar21 = me->_channelData;
          if (pCVar21[uVar22].processed == 0) {
            peVar12 = pCVar21[uVar22].chan;
            cVar6 = peVar12->bytes_per_element;
            CVar7 = pCVar21[uVar22].compression;
            if (CVar7 == UNKNOWN) {
              iVar23 = me->_max[1];
              if (me->_min[1] <= iVar23) {
                __n = (long)(int)cVar6 * (long)peVar12->width;
                iVar28 = 0;
                iVar33 = me->_min[1];
                do {
                  if (iVar33 % peVar12->y_samples == 0) {
                    if (me->_planarUncBuffer[0] + me->_planarUncBufferSize[0] <
                        pCVar21[uVar22].planarUncBufferEnd + __n) {
                      return 0x17;
                    }
                    memcpy(pCVar21[uVar22]._dctData._rows[iVar28],pCVar21[uVar22].planarUncBufferEnd
                           ,__n);
                    pCVar21[uVar22].planarUncBufferEnd = pCVar21[uVar22].planarUncBufferEnd + __n;
                    iVar28 = iVar28 + 1;
                    iVar23 = me->_max[1];
                  }
                  bVar31 = iVar33 < iVar23;
                  iVar33 = iVar33 + 1;
                } while (bVar31);
              }
            }
            else if (CVar7 == RLE) {
              iVar23 = me->_max[1];
              if (me->_min[1] <= iVar23) {
                iVar28 = 0;
                iVar33 = me->_min[1];
                do {
                  if (iVar33 % peVar12->y_samples == 0) {
                    puVar26 = pCVar21[uVar22]._dctData._rows[iVar28];
                    if (cVar6 == '\x02') {
                      interleaveByte2(puVar26,pCVar21[uVar22].planarUncRleEnd[0],
                                      pCVar21[uVar22].planarUncRleEnd[1],peVar12->width);
                      iVar23 = peVar12->width;
                      pCVar21[uVar22].planarUncRleEnd[0] =
                           pCVar21[uVar22].planarUncRleEnd[0] + iVar23;
                      pCVar21[uVar22].planarUncRleEnd[1] =
                           pCVar21[uVar22].planarUncRleEnd[1] + iVar23;
                    }
                    else {
                      iVar23 = peVar12->width;
                      if (0 < iVar23) {
                        iVar18 = 0;
                        do {
                          if ('\0' < cVar6) {
                            uVar20 = 0;
                            do {
                              puVar3 = *(uint8_t **)
                                        ((long)(pCVar21->_dctData)._dctData +
                                        uVar20 * 8 + lVar25 + -0x20);
                              *(uint8_t **)
                               ((long)(pCVar21->_dctData)._dctData + uVar20 * 8 + lVar25 + -0x20) =
                                   puVar3 + 1;
                              puVar26[uVar20] = *puVar3;
                              uVar20 = uVar20 + 1;
                            } while ((uint)(int)cVar6 != uVar20);
                            iVar23 = peVar12->width;
                            puVar26 = puVar26 + uVar20;
                          }
                          iVar18 = iVar18 + 1;
                        } while (iVar18 < iVar23);
                      }
                    }
                    iVar28 = iVar28 + 1;
                    iVar23 = me->_max[1];
                  }
                  bVar31 = iVar33 < iVar23;
                  iVar33 = iVar33 + 1;
                } while (bVar31);
              }
            }
            else {
              if (CVar7 != LOSSY_DCT) {
                return 0x17;
              }
              bVar31 = peVar12->p_linear == '\0';
              local_a8._16_8_ = puVar27 + nRaw * 2;
              local_a8._32_8_ = (unsigned_short *)0x0;
              if (bVar31) {
                local_a8._32_8_ = dwaCompressorToLinear;
              }
              auVar15._8_8_ = 0;
              auVar15._0_8_ = puVar27;
              local_a8._0_16_ = auVar15 << 0x40;
              uVar2 = peVar12->height;
              uVar5 = peVar12->width;
              local_a8._44_4_ = uVar2;
              local_a8._40_4_ = uVar5;
              if (!bVar31) {
                local_a8._32_8_ = dwaCompressorNoOp;
              }
              local_a8._48_8_ = &pCVar21[uVar22]._dctData;
              stack0xffffffffffffff90 = (undefined1  [16])0x0;
              local_60 = 1;
              local_a8._24_8_ = local_f0;
              eVar16 = LossyDctDecoder_execute((LossyDctDecoder *)local_a8);
              if (eVar16 != 0) {
                return eVar16;
              }
              puVar27 = puVar27 + (long)(int)local_a8._0_4_ * 2;
              local_f0 = local_f0 + (long)(int)local_a8._4_4_ * 2;
            }
            pCVar21[uVar22].processed = 1;
            iVar23 = me->_numChannels;
          }
          uVar22 = uVar22 + 1;
          lVar25 = lVar25 + 0x240;
          eVar16 = 0;
        } while (uVar22 < (ulong)(long)iVar23);
      }
    }
  }
  else {
    pcVar13 = (char *)(uVar8 * 2);
    if (pcVar13 <= (char *)me->_packedDcBufferSize) {
      peVar10 = me->_decode;
      eVar16 = internal_decode_alloc_buffer
                         (peVar10,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar10->scratch_buffer_1,
                          &peVar10->scratch_alloc_size_1,(size_t)pcVar13);
      if (eVar16 != 0) {
        return eVar16;
      }
      eVar16 = exr_uncompress_buffer
                         (puVar3 + in_bytes,uVar20,me->_decode->scratch_buffer_1,(size_t)pcVar13,
                          (size_t *)local_a8);
      if (eVar16 == 0) {
        if (pcVar13 != (char *)local_a8._0_8_) {
          return 0x17;
        }
        internal_zip_reconstruct_bytes
                  (me->_packedDcBuffer,(uint8_t *)me->_decode->scratch_buffer_1,(uint64_t)pcVar13);
        goto LAB_0010a802;
      }
    }
    eVar16 = 0x17;
  }
  return eVar16;
}

Assistant:

exr_result_t
DwaCompressor_uncompress (
    DwaCompressor* me,
    const uint8_t* inPtr,
    uint64_t       iSize,
    void*          uncompressed_data,
    uint64_t       uncompressed_size)
{
    uint64_t     headerSize = NUM_SIZES_SINGLE * sizeof (uint64_t);
    exr_result_t rv         = EXR_ERR_SUCCESS;

    if (iSize < headerSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated header).");
    }

    //
    // Flip the counters from XDR to NATIVE
    //
    uint64_t counters[NUM_SIZES_SINGLE];

    memset (uncompressed_data, 0, uncompressed_size);

    memcpy (counters, inPtr, headerSize);
    priv_to_native64 (counters, NUM_SIZES_SINGLE);

    //
    // Unwind all the counter info
    //
    uint64_t version                 = counters[VERSION];
    uint64_t unknownUncompressedSize = counters[UNKNOWN_UNCOMPRESSED_SIZE];
    uint64_t unknownCompressedSize   = counters[UNKNOWN_COMPRESSED_SIZE];
    uint64_t acCompressedSize        = counters[AC_COMPRESSED_SIZE];
    uint64_t dcCompressedSize        = counters[DC_COMPRESSED_SIZE];
    uint64_t rleCompressedSize       = counters[RLE_COMPRESSED_SIZE];
    uint64_t rleUncompressedSize     = counters[RLE_UNCOMPRESSED_SIZE];
    uint64_t rleRawSize              = counters[RLE_RAW_SIZE];

    uint64_t totalAcUncompressedCount = counters[AC_UNCOMPRESSED_COUNT];
    uint64_t totalDcUncompressedCount = counters[DC_UNCOMPRESSED_COUNT];

    uint64_t acCompression = counters[AC_COMPRESSION];

    uint64_t compressedSize = unknownCompressedSize + acCompressedSize +
                              dcCompressedSize + rleCompressedSize;

    const uint8_t* dataPtr  = inPtr + headerSize;
    uint64_t       dataLeft = iSize - headerSize;

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize || iSize < acCompressedSize ||
        iSize < dcCompressedSize || iSize < rleCompressedSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated file).");
    }

    if ((int64_t) unknownUncompressedSize < 0 ||
        (int64_t) unknownCompressedSize < 0 || (int64_t) acCompressedSize < 0 ||
        (int64_t) dcCompressedSize < 0 || (int64_t) rleCompressedSize < 0 ||
        (int64_t) rleUncompressedSize < 0 || (int64_t) rleRawSize < 0 ||
        (int64_t) totalAcUncompressedCount < 0 ||
        (int64_t) totalDcUncompressedCount < 0)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               " (corrupt header).");
    }

    if (version < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        uint64_t ruleSize;
        rv =
            DwaCompressor_readChannelRules (me, &dataPtr, &dataLeft, &ruleSize);

        headerSize += ruleSize;
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    size_t outBufferSize = 0;
    rv                   = DwaCompressor_initializeBuffers (me, &outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    // the C++ classes used to have one buffer size for compress / uncompress
    // but here we want to do zero-ish copy...
    uint8_t* outBufferEnd = (uint8_t*) me->_decode->unpacked_buffer;
    //if (outBufferSize > me->_decode->unpacked_alloc_size)
    //{
    //    printf( "outbuffersize %lu larger than unpacked size %lu\n", outBufferSize, me->_decode->unpacked_alloc_size );
    //    return EXR_ERR_OUT_OF_MEMORY;
    //}
    outBufferSize = me->_decode->unpacked_alloc_size;

    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy
    // if you want to decode the channels in parallel later on.
    //

    uint8_t* packedAcBufferEnd = 0;

    if (me->_packedAcBuffer) packedAcBufferEnd = me->_packedAcBuffer;

    uint8_t* packedDcBufferEnd = 0;

    if (me->_packedDcBuffer) packedDcBufferEnd = me->_packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the
    // Huffman-compressed AC, then the DC values,
    // and then the zlib compressed RLE data.
    //

    const uint8_t* compressedUnknownBuf = dataPtr;

    const uint8_t* compressedAcBuf =
        compressedUnknownBuf + (ptrdiff_t) (unknownCompressedSize);
    const uint8_t* compressedDcBuf =
        compressedAcBuf + (ptrdiff_t) (acCompressedSize);
    const uint8_t* compressedRleBuf =
        compressedDcBuf + (ptrdiff_t) (dcCompressedSize);

    //
    // Sanity check that the version is something we expect. Right now,
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the
    // start of the data block.
    //

    if (version > 2)
    {
        return EXR_ERR_BAD_CHUNK_LEADER;
        //throw IEX_NAMESPACE::InputExc (
        //    "Invalid version of compressed data block");
    }

    rv = DwaCompressor_setupChannelData (me);

    //
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > me->_planarUncBufferSize[UNKNOWN])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedUnknownBuf,
                                   unknownCompressedSize,
                                   me->_planarUncBuffer[UNKNOWN],
                                   unknownUncompressedSize,
                                   NULL))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing UNKNOWN data.");
        }
    }

    //
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if (!me->_packedAcBuffer ||
            totalAcUncompressedCount * sizeof (uint16_t) >
                me->_packedAcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
            case STATIC_HUFFMAN:
                rv = internal_huf_decompress (
                    me->_decode,
                    compressedAcBuf,
                    acCompressedSize,
                    (uint16_t*) me->_packedAcBuffer,
                    totalAcUncompressedCount,
                    me->_decode->scratch_buffer_1,
                    me->_decode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS) { return rv; }
                break;

            case DEFLATE: {
                size_t destLen;

                rv = exr_uncompress_buffer (
                    compressedAcBuf,
                    acCompressedSize,
                    me->_packedAcBuffer,
                    totalAcUncompressedCount * sizeof (uint16_t),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (uint16_t) != destLen)
                {
                    return EXR_ERR_CORRUPT_CHUNK;
                    //throw IEX_NAMESPACE::InputExc ("AC data corrupt.");
                }
            }
            break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
                break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        size_t destLen;
        size_t uncompBytes = totalDcUncompressedCount * sizeof (uint16_t);
        if (uncompBytes > me->_packedDcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        rv = internal_decode_alloc_buffer (
            me->_decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_decode->scratch_buffer_1),
            &(me->_decode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = exr_uncompress_buffer (
            compressedDcBuf,
            dcCompressedSize,
            me->_decode->scratch_buffer_1,
            uncompBytes,
            &destLen);
        if (rv != EXR_ERR_SUCCESS || (uncompBytes != destLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }

        internal_zip_reconstruct_bytes (
            me->_packedDcBuffer, (uint8_t*) me->_decode->scratch_buffer_1, uncompBytes);
    }
    else
    {
        // if the compressed size is 0, then the uncompressed size must also be zero
        if (totalDcUncompressedCount != 0)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > me->_rleBufferSize ||
            rleRawSize > me->_planarUncBufferSize[RLE])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        size_t dstLen;

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedRleBuf,
                                   rleCompressedSize,
                                   me->_rleBuffer,
                                   rleUncompressedSize,
                                   &dstLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }

        if (internal_rle_decompress (
                me->_planarUncBuffer[RLE],
                rleRawSize,
                (const uint8_t*) me->_rleBuffer,
                rleUncompressedSize) != rleRawSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), outBufferEnd);
            if (rv != EXR_ERR_SUCCESS) return rv;

            outBufferEnd += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctDecoder decoder;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        int rChan = cset->idx[0];
        int gChan = cset->idx[1];
        int bChan = cset->idx[2];

        if (me->_channelData[rChan].compression != LOSSY_DCT ||
            me->_channelData[gChan].compression != LOSSY_DCT ||
            me->_channelData[bChan].compression != LOSSY_DCT)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Bad DWA compression type detected");
        }

        rv = LossyDctDecoderCsc_construct (
            &decoder,
            &(me->_channelData[rChan]._dctData),
            &(me->_channelData[gChan]._dctData),
            &(me->_channelData[bChan]._dctData),
            packedAcBufferEnd,
            packedAcBufferEnd + totalAcUncompressedCount * sizeof (uint16_t),
            packedDcBufferEnd,
            dwaCompressorToLinear,
            me->_channelData[rChan].chan->width,
            me->_channelData[rChan].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctDecoder_execute (&decoder);

        packedAcBufferEnd += decoder._packedAcCount * sizeof (uint16_t);

        packedDcBufferEnd += decoder._packedDcCount * sizeof (uint16_t);

        me->_channelData[rChan].processed = 1;
        me->_channelData[gChan].processed = 1;
        me->_channelData[bChan].processed = 1;

        LossyDctDecoder_destroy (&decoder);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*               cd      = &(me->_channelData[c]);
        exr_coding_channel_info_t* chan    = cd->chan;
        DctCoderChannelData*       dcddata = &(cd->_dctData);

        if (cd->processed) continue;

        int pixelSize = chan->bytes_per_element;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // Setup a single-channel lossy DCT decoder pointing
                // at the output buffer
                //

                {
                    const uint16_t* linearLut = NULL;
                    LossyDctDecoder decoder;

                    if (!chan->p_linear) linearLut = dwaCompressorToLinear;

                    rv = LossyDctDecoder_construct (
                        &decoder,
                        dcddata,
                        packedAcBufferEnd,
                        packedAcBufferEnd +
                            totalAcUncompressedCount * sizeof (uint16_t),
                        packedDcBufferEnd,
                        linearLut,
                        chan->width,
                        chan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctDecoder_execute (&decoder);

                    packedAcBufferEnd +=
                        decoder._packedAcCount * sizeof (uint16_t);

                    packedDcBufferEnd +=
                        decoder._packedDcCount * sizeof (uint16_t);

                    LossyDctDecoder_destroy (&decoder);
                    if (rv != EXR_ERR_SUCCESS) { return rv; }
                }

                break;

            case RLE:

                //
                // For the RLE case, the data has been un-RLE'd into
                // planarUncRleEnd[], but is still split out by bytes.
                // We need to rearrange the bytes back into the correct
                // order in the output buffer;
                //

                {
                    int row = 0;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        uint8_t* dst = dcddata->_rows[row];

                        if (pixelSize == 2)
                        {
                            interleaveByte2 (
                                dst,
                                cd->planarUncRleEnd[0],
                                cd->planarUncRleEnd[1],
                                chan->width);

                            cd->planarUncRleEnd[0] += chan->width;
                            cd->planarUncRleEnd[1] += chan->width;
                        }
                        else
                        {
                            for (int x = 0; x < chan->width; ++x)
                            {
                                for (int byte = 0; byte < pixelSize; ++byte)
                                {
                                    *dst++ = *cd->planarUncRleEnd[byte]++;
                                }
                            }
                        }

                        row++;
                    }
                }

                break;

            case UNKNOWN:

                //
                // In the UNKNOWN case, data is already in planarUncBufferEnd
                // and just needs to copied over to the output buffer
                //

                {
                    int row             = 0;
                    int dstScanlineSize = chan->width * pixelSize;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        //
                        // sanity check for buffer data lying within range
                        //
                        if ((cd->planarUncBufferEnd +
                             (size_t) (dstScanlineSize)) >
                            (me->_planarUncBuffer[UNKNOWN] +
                             me->_planarUncBufferSize[UNKNOWN]))
                        {
                            return EXR_ERR_CORRUPT_CHUNK;
                            //throw IEX_NAMESPACE::InputExc ("DWA data corrupt");
                        }

                        memcpy (
                            dcddata->_rows[row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                        cd->planarUncBufferEnd += dstScanlineSize;
                        row++;
                    }
                }

                break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc (
                //    "Unhandled compression scheme case");
                break;
        }

        cd->processed = 1;
    }

    return rv;
}